

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::EdgeDescriptorSyntax::setChild
          (EdgeDescriptorSyntax *this,size_t index,TokenOrSyntax child)

{
  logic_error *this_00;
  Token TVar1;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  EdgeDescriptorSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar1._0_8_;
    (this->t1).kind = (undefined2)local_28;
    (this->t1).field_0x2 = local_28._2_1_;
    (this->t1).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->t1).rawLen = local_28._4_4_;
    local_20 = TVar1.info;
    (this->t1).info = local_20;
  }
  else {
    if (index != 1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_b8,&local_d8,":");
      std::__cxx11::to_string(&local_110,0x12c8);
      std::operator+(&local_98,&local_b8,&local_110);
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_58);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar1._0_8_;
    (this->t2).kind = (undefined2)local_38;
    (this->t2).field_0x2 = local_38._2_1_;
    (this->t2).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->t2).rawLen = local_38._4_4_;
    local_30 = TVar1.info;
    (this->t2).info = local_30;
  }
  return;
}

Assistant:

void EdgeDescriptorSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: t1 = child.token(); return;
        case 1: t2 = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}